

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O2

void __thiscall bloaty::Options::InternalSwap(Options *this,Options *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  int32 iVar4;
  void *pvVar5;
  uint64 uVar6;
  int64 iVar7;
  string *psVar8;
  UnknownFieldSet *other_00;
  
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_00185220;
LAB_00185213:
    other_00 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_00185213;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_00185220:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->filename_).super_RepeatedPtrFieldBase,
             &(other->filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->base_filename_).super_RepeatedPtrFieldBase,
             &(other->base_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->data_source_).super_RepeatedPtrFieldBase,
             &(other->data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->custom_data_source_).super_RepeatedPtrFieldBase,
             &(other->custom_data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->debug_filename_).super_RepeatedPtrFieldBase,
             &(other->debug_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->source_map_).super_RepeatedPtrFieldBase,
             &(other->source_map_).super_RepeatedPtrFieldBase);
  if (((this->disassemble_function_).ptr_ !=
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->disassemble_function_).ptr_ !=
      (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar8 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (&this->disassemble_function_,
                        (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                        (Arena *)0x0);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (&other->disassemble_function_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (Arena *)0x0);
    std::__cxx11::string::swap((string *)psVar8);
  }
  if (((this->source_filter_).ptr_ !=
       (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->source_filter_).ptr_ !=
      (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar8 = google::protobuf::internal::ArenaStringPtr::Mutable
                       (&this->source_filter_,
                        (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                        (Arena *)0x0);
    google::protobuf::internal::ArenaStringPtr::Mutable
              (&other->source_filter_,
               (string *)google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
               (Arena *)0x0);
    std::__cxx11::string::swap((string *)psVar8);
  }
  iVar3 = this->demangle_;
  this->demangle_ = other->demangle_;
  other->demangle_ = iVar3;
  iVar3 = this->sort_by_;
  this->sort_by_ = other->sort_by_;
  other->sort_by_ = iVar3;
  iVar4 = this->verbose_level_;
  this->verbose_level_ = other->verbose_level_;
  other->verbose_level_ = iVar4;
  bVar1 = this->dump_raw_map_;
  this->dump_raw_map_ = other->dump_raw_map_;
  other->dump_raw_map_ = bVar1;
  uVar6 = this->debug_vmaddr_;
  this->debug_vmaddr_ = other->debug_vmaddr_;
  other->debug_vmaddr_ = uVar6;
  uVar6 = this->debug_fileoff_;
  this->debug_fileoff_ = other->debug_fileoff_;
  other->debug_fileoff_ = uVar6;
  iVar7 = this->max_rows_per_level_;
  this->max_rows_per_level_ = other->max_rows_per_level_;
  other->max_rows_per_level_ = iVar7;
  return;
}

Assistant:

void Options::InternalSwap(Options* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  filename_.InternalSwap(&other->filename_);
  base_filename_.InternalSwap(&other->base_filename_);
  data_source_.InternalSwap(&other->data_source_);
  custom_data_source_.InternalSwap(&other->custom_data_source_);
  debug_filename_.InternalSwap(&other->debug_filename_);
  source_map_.InternalSwap(&other->source_map_);
  disassemble_function_.Swap(&other->disassemble_function_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  source_filter_.Swap(&other->source_filter_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(demangle_, other->demangle_);
  swap(sort_by_, other->sort_by_);
  swap(verbose_level_, other->verbose_level_);
  swap(dump_raw_map_, other->dump_raw_map_);
  swap(debug_vmaddr_, other->debug_vmaddr_);
  swap(debug_fileoff_, other->debug_fileoff_);
  swap(max_rows_per_level_, other->max_rows_per_level_);
}